

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeModuleDefinitionInfo
          (cmGeneratorTarget *this,string *config,ModuleDefinitionInfo *info)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  reference ppcVar3;
  string *psVar4;
  bool local_ea;
  bool local_da;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  byte local_7b;
  byte local_7a;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ModuleDefinitionInfo *local_20;
  ModuleDefinitionInfo *info_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_20 = info;
  info_local = (ModuleDefinitionInfo *)config;
  config_local = (string *)this;
  GetModuleDefinitionSources(this,&info->Sources,config);
  this_00 = this->Makefile;
  std::allocator<char>::allocator();
  local_7a = 0;
  local_7b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS",&local_41);
  bVar1 = cmMakefile::IsOn(this_00,&local_40);
  local_da = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"WINDOWS_EXPORT_ALL_SYMBOLS",&local_79);
    local_7b = 1;
    local_da = GetPropertyAsBool(this,&local_78);
  }
  local_20->WindowsExportAllSymbols = local_da;
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator(&local_79);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_ea = true;
  if ((local_20->WindowsExportAllSymbols & 1U) == 0) {
    sVar2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::size
                      (&local_20->Sources);
    local_ea = 1 < sVar2;
  }
  local_20->DefFileGenerated = local_ea;
  if ((local_20->DefFileGenerated & 1U) == 0) {
    bVar1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::empty
                      (&local_20->Sources);
    if (!bVar1) {
      ppcVar3 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::front
                          (&local_20->Sources);
      psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar3);
      std::__cxx11::string::operator=((string *)local_20,(string *)psVar4);
    }
  }
  else {
    GetObjectDirectory(&local_c0,this,&info_local->DefFile);
    std::operator+(&local_a0,&local_c0,"exports.def");
    std::__cxx11::string::operator=((string *)local_20,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeModuleDefinitionInfo(
  std::string const& config, ModuleDefinitionInfo& info) const
{
  this->GetModuleDefinitionSources(info.Sources, config);
  info.WindowsExportAllSymbols =
    this->Makefile->IsOn("CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS") &&
    this->GetPropertyAsBool("WINDOWS_EXPORT_ALL_SYMBOLS");
#if !defined(CMAKE_BOOTSTRAP)
  info.DefFileGenerated =
    info.WindowsExportAllSymbols || info.Sources.size() > 1;
#else
  // Our __create_def helper is not available during CMake bootstrap.
  info.DefFileGenerated = false;
#endif
  if (info.DefFileGenerated) {
    info.DefFile =
      this->GetObjectDirectory(config) /* has slash */ + "exports.def";
  } else if (!info.Sources.empty()) {
    info.DefFile = info.Sources.front()->GetFullPath();
  }
}